

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O2

_Bool effect_handler_DETECT_DOORS(effect_handler_context_t_conflict *context)

{
  _Bool _Var1;
  int iVar2;
  loc grid;
  int iVar3;
  int y;
  int iVar4;
  int iVar5;
  char *fmt;
  int iVar6;
  
  iVar4 = (player->grid).x;
  iVar3 = (player->grid).y;
  y = iVar3 - context->y;
  iVar3 = context->y + iVar3;
  iVar2 = iVar4 - context->x;
  iVar4 = context->x + iVar4;
  iVar6 = 0;
  if (y < 1) {
    y = iVar6;
  }
  if (iVar2 < 1) {
    iVar2 = 0;
  }
  iVar5 = cave->height + -1;
  if (iVar3 < cave->height) {
    iVar5 = iVar3;
  }
  iVar3 = cave->width + -1;
  if (iVar4 < cave->width) {
    iVar3 = iVar4;
  }
  for (; iVar4 = iVar2, y < iVar5; y = y + 1) {
    for (; iVar4 < iVar3; iVar4 = iVar4 + 1) {
      grid = (loc)loc(iVar4,y);
      _Var1 = square_in_bounds_fully(cave,grid);
      if (_Var1) {
        _Var1 = square_issecretdoor(cave,grid);
        if (_Var1) {
          place_closed_door(cave,(loc_conflict)grid);
LAB_0013c9f7:
          square_memorize(cave,grid);
          square_light_spot((chunk *)cave,grid);
          iVar6 = 1;
        }
        else {
          _Var1 = square_isdoor(cave,grid);
          if (_Var1) {
            _Var1 = square_ismemorybad(cave,grid);
            if (_Var1) goto LAB_0013c9f7;
          }
          else {
            _Var1 = square_isdoor((chunk_conflict *)player->cave,grid);
            if ((_Var1) && (_Var1 = square_ismemorybad(cave,grid), _Var1)) {
              square_forget(cave,grid);
            }
          }
        }
      }
    }
  }
  if (iVar6 == 0) {
    if (context->aware != true) goto LAB_0013ca9c;
    fmt = "You sense no doors.";
  }
  else {
    fmt = "You sense the presence of doors!";
  }
  msg(fmt);
LAB_0013ca9c:
  context->ident = true;
  return true;
}

Assistant:

bool effect_handler_DETECT_DOORS(effect_handler_context_t *context)
{
	int x, y;
	int x1, x2, y1, y2;

	bool doors = false;

	/* Pick an area to detect */
	y1 = player->grid.y - context->y;
	y2 = player->grid.y + context->y;
	x1 = player->grid.x - context->x;
	x2 = player->grid.x + context->x;

	if (y1 < 0) y1 = 0;
	if (x1 < 0) x1 = 0;
	if (y2 > cave->height - 1) y2 = cave->height - 1;
	if (x2 > cave->width - 1) x2 = cave->width - 1;

	/* Scan the dungeon */
	for (y = y1; y < y2; y++) {
		for (x = x1; x < x2; x++) {
			struct loc grid = loc(x, y);

			if (!square_in_bounds_fully(cave, grid)) continue;

			if (square_issecretdoor(cave, grid)) {
				/* Detect secret doors */
				/* Put an actual door */
				place_closed_door(cave, grid);

				/* Memorize */
				square_memorize(cave, grid);
				square_light_spot(cave, grid);

				/* Obvious */
				doors = true;
			} else if (square_isdoor(cave, grid)) {
				/* Detect other types of doors. */
				if (square_ismemorybad(cave, grid)) {
					square_memorize(cave, grid);
					square_light_spot(cave, grid);
					doors = true;
				}
			} else if (square_isdoor(player->cave, grid)
					&& square_ismemorybad(cave, grid)) {
				/*
				 * Forget misremembered doors in the mapping
				 * area.
				 */
				square_forget(cave, grid);
			}
		}
	}

	/* Describe */
	if (doors)
		msg("You sense the presence of doors!");
	else if (context->aware)
		msg("You sense no doors.");

	context->ident = true;

	return true;
}